

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

uint * vector_sum(uint *a,uint a_len,uint *b,uint b_len,uint *new_len)

{
  uint *puVar1;
  ulong uVar2;
  
  if (a_len == b_len) {
    puVar1 = vector_new(a_len);
    if (new_len != (uint *)0x0) {
      *new_len = a_len;
    }
    for (uVar2 = 0; a_len != uVar2; uVar2 = uVar2 + 1) {
      puVar1[uVar2] = b[uVar2] + a[uVar2];
    }
    return puVar1;
  }
  fatal((uchar *)"vector_sum",(uchar *)"a_len should be equal to b_len\n");
}

Assistant:

uint32_t *vector_sum(uint32_t *a, uint32_t a_len, uint32_t *b, uint32_t b_len, uint32_t *new_len)
{
    if (a_len != b_len)
        fatal("vector_sum", "a_len should be equal to b_len\n");

    uint32_t *c = vector_new(a_len);

    if (new_len != NULL)
        *new_len = a_len;

    for (uint32_t i = 0; i < a_len; i++)
        c[i] = a[i] + b[i];
    return c;
}